

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcGen.c
# Opt level: O1

int Gia_ManTestSatEnum(Gia_Man_t *p)

{
  word *pwVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  sat_solver *s;
  uint *__ptr;
  void *pvVar5;
  long lVar6;
  long lVar7;
  Cnf_Dat_t *pCVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  timespec ts;
  int iLit;
  uint local_70;
  timespec local_68;
  Cnf_Dat_t *local_58;
  uint local_50;
  lit local_4c;
  long local_48;
  sat_solver *local_40;
  long local_38;
  
  iVar2 = clock_gettime(3,&local_68);
  if (iVar2 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  local_58 = Mf_ManGenerateCnf(p,8,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(local_58,1,0);
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar5 = malloc(4000);
  *(void **)(__ptr + 2) = pvVar5;
  local_4c = 2;
  local_40 = s;
  iVar2 = sat_solver_addclause(s,&local_4c,(lit *)&local_48);
  if (iVar2 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcGen.c"
                  ,0x8f,"int Gia_ManTestSatEnum(Gia_Man_t *)");
  }
  Gia_ManMoFindSimulate(p,1);
  if (p->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar2 = *p->vCos->pArray;
  if ((iVar2 < 0) || (p->nObjs <= iVar2)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar3 = iVar2 * p->iPatsPi;
  if ((-1 < (int)uVar3) && ((int)uVar3 < p->vSims->nSize)) {
    pwVar1 = p->vSims->pArray;
    uVar9 = 0;
    local_48 = lVar7;
    do {
      printf("%d",(ulong)((*(uint *)((long)pwVar1 + (ulong)(uVar9 >> 5) * 4 + (ulong)uVar3 * 8) >>
                           (uVar9 & 0x1f) & 1) != 0));
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0x40);
    putchar(10);
    lVar7 = 0;
    uVar3 = 0;
    local_70 = 0;
    do {
      uVar9 = 0;
      local_50 = uVar3;
      local_38 = lVar7;
      if (0 < p->nObjs) {
        lVar7 = 0;
        uVar9 = 0;
        pCVar8 = local_58;
        do {
          iVar2 = pCVar8->pVarNums[lVar7];
          if (iVar2 != -1) {
            uVar3 = p->iPatsPi * (int)lVar7;
            if (((int)uVar3 < 0) || (p->vSims->nSize <= (int)uVar3)) {
              __ptr[1] = uVar9;
              goto LAB_0053bc72;
            }
            if ((*(uint *)((long)p->vSims->pArray + (ulong)(local_70 >> 5) * 4 + (ulong)uVar3 * 8) &
                1 << ((byte)local_70 & 0x1f)) != 0) {
              uVar3 = *__ptr;
              if (uVar9 == uVar3) {
                if ((int)uVar3 < 0x10) {
                  if (*(void **)(__ptr + 2) == (void *)0x0) {
                    pvVar5 = malloc(0x40);
                  }
                  else {
                    pvVar5 = realloc(*(void **)(__ptr + 2),0x40);
                  }
                  *(void **)(__ptr + 2) = pvVar5;
                  uVar10 = 0x10;
                }
                else {
                  uVar10 = uVar3 * 2;
                  if ((int)uVar10 <= (int)uVar3) goto LAB_0053b9f0;
                  if (*(void **)(__ptr + 2) == (void *)0x0) {
                    pvVar5 = malloc((ulong)uVar3 << 3);
                  }
                  else {
                    pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar3 << 3);
                  }
                  *(void **)(__ptr + 2) = pvVar5;
                }
                if (pvVar5 == (void *)0x0) {
                  __ptr[1] = uVar9;
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
                *__ptr = uVar10;
                pCVar8 = local_58;
              }
LAB_0053b9f0:
              lVar6 = (long)(int)uVar9;
              uVar9 = uVar9 + 1;
              *(int *)(*(long *)(__ptr + 2) + lVar6 * 4) = iVar2;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < p->nObjs);
      }
      iVar2 = clock_gettime(3,&local_68);
      lVar6 = local_38;
      if (iVar2 < 0) {
        lVar11 = 1;
      }
      else {
        lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
        lVar11 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_68.tv_sec * -1000000;
      }
      iVar2 = sat_solver_solve(local_40,(lit *)0x0,(lit *)0x0,0,0,0,0);
      iVar4 = clock_gettime(3,&local_68);
      if (iVar4 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      lVar7 = lVar6 + lVar11 + lVar7;
      putchar((uint)(iVar2 != 1) * 2 + 0x2b);
      uVar3 = local_50 + (iVar2 == 1);
      local_70 = local_70 + 1;
      if (local_70 == 0x40) {
        __ptr[1] = uVar9;
        putchar(10);
        printf("Finished generating %d assignments.  ",(ulong)uVar3);
        iVar4 = 3;
        iVar2 = clock_gettime(3,&local_68);
        if (iVar2 < 0) {
          lVar6 = -1;
        }
        else {
          lVar6 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
        }
        lVar6 = lVar6 + local_48;
        Abc_Print(iVar4,"%s =","Time");
        Abc_Print(iVar4,"%9.2f sec\n",(double)lVar6 / 1000000.0);
        Abc_Print(iVar4,"%s =","SAT solver time");
        Abc_Print(iVar4,"%9.2f sec\n",(double)lVar7 / 1000000.0);
        if (p->vSims != (Vec_Wrd_t *)0x0) {
          pwVar1 = p->vSims->pArray;
          if (pwVar1 != (word *)0x0) {
            free(pwVar1);
            p->vSims->pArray = (word *)0x0;
          }
          if (p->vSims != (Vec_Wrd_t *)0x0) {
            free(p->vSims);
            p->vSims = (Vec_Wrd_t *)0x0;
          }
        }
        if (*(void **)(__ptr + 2) != (void *)0x0) {
          free(*(void **)(__ptr + 2));
          __ptr[2] = 0;
          __ptr[3] = 0;
        }
        free(__ptr);
        sat_solver_delete(local_40);
        Cnf_DataFree(local_58);
        return 1;
      }
    } while( true );
  }
LAB_0053bc72:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

int Gia_ManTestSatEnum( Gia_Man_t * p )
{
    abctime clk = Abc_Clock(), clk2, clkTotal = 0;
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( p, 8, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    int i, v, status, iLit, nWords = 1, iOutVar = 1, Count = 0;
    Vec_Int_t * vVars = Vec_IntAlloc( 1000 );
    word * pSimInfo;

    // add literals to the solver
    iLit  = Abc_Var2Lit( iOutVar, 0 ); 
    status = sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    assert( status );

    // simulate the AIG
    Gia_ManMoFindSimulate( p, nWords );

    // print outputs
    pSimInfo = Gia_ManMoObj( p, Gia_ObjId(p, Gia_ManCo(p, 0)) );
    for ( i = 0; i < 64*nWords; i++ )
        printf( "%d", Abc_InfoHasBit( (unsigned *)pSimInfo, i ) );
    printf( "\n" );

    // iterate through the assignments
    for ( i = 0; i < 64*nWords; i++ )
    {
        Vec_IntClear( vVars );
        for ( v = 0; v < Gia_ManObjNum(p); v++ )
        {
            if ( pCnf->pVarNums[v] == -1 )
                continue;
            pSimInfo = Gia_ManMoObj( p, v );
            if ( !Abc_InfoHasBit( (unsigned *)pSimInfo, i ) )
                continue;
            Vec_IntPush( vVars, pCnf->pVarNums[v] );
        }
        //sat_solver_act_var_clear( pSat );
        //sat_solver_set_polarity( pSat, Vec_IntArray(vVars), Vec_IntSize(vVars) );

        clk2 = Abc_Clock();
        status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        clkTotal += Abc_Clock() - clk2;
        printf( "%c", status == l_True ? '+' : '-' );
        if ( status == l_True )
            Count++;
    }
    printf( "\n" );
    printf( "Finished generating %d assignments.  ", Count );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Abc_PrintTime( 1, "SAT solver time", clkTotal );

    Vec_WrdFreeP( &p->vSims );
    Vec_IntFree( vVars );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    return 1;
}